

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIFileOpenDialog * __thiscall
irr::gui::CGUIEnvironment::addFileOpenDialog
          (CGUIEnvironment *this,wchar_t *title,bool modal,IGUIElement *parent,s32 id,
          bool restoreCWD,char_type *startDir)

{
  byte in_DL;
  IReferenceCounted *in_stack_00000008;
  IGUIFileOpenDialog *d;
  bool in_stack_00000153;
  s32 in_stack_00000154;
  IGUIElement *in_stack_00000158;
  IGUIEnvironment *in_stack_00000160;
  wchar_t *in_stack_00000168;
  CGUIFileOpenDialog *in_stack_00000170;
  char_type *in_stack_00000180;
  IGUIFileOpenDialog *local_8;
  
  if ((in_DL & 1) == 0) {
    local_8 = (IGUIFileOpenDialog *)operator_new(0x280);
    CGUIFileOpenDialog::CGUIFileOpenDialog
              (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
               in_stack_00000154,in_stack_00000153,in_stack_00000180);
    IReferenceCounted::drop(in_stack_00000008);
  }
  else {
    local_8 = (IGUIFileOpenDialog *)0x0;
  }
  return local_8;
}

Assistant:

IGUIFileOpenDialog *CGUIEnvironment::addFileOpenDialog(const wchar_t *title,
		bool modal, IGUIElement *parent, s32 id,
		bool restoreCWD, io::path::char_type *startDir)
{
	parent = parent ? parent : this;

	if (modal)
		return nullptr;

	IGUIFileOpenDialog *d = new CGUIFileOpenDialog(title, this, parent, id,
			restoreCWD, startDir);
	d->drop();

	return d;
}